

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O2

void writevector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *c,string *filename)

{
  pointer pbVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  ofstream myfile;
  
  std::ofstream::ofstream((string *)&myfile);
  std::ofstream::open((string *)&myfile,(_Ios_Openmode)filename);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"\nfailure to write file");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  bVar7 = 1;
  lVar6 = 0;
  for (uVar5 = 0;
      pbVar1 = (c->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(c->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar5 = uVar5 + 1) {
    std::operator<<((ostream *)&myfile,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((c->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6),")");
    if ((bVar3 & bVar7) == 1) {
      std::endl<char,std::char_traits<char>>((ostream *)&myfile);
      bVar7 = 0;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((c->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6),";");
    if (bVar3) {
      std::endl<char,std::char_traits<char>>((ostream *)&myfile);
    }
    lVar6 = lVar6 + 0x20;
  }
  std::ofstream::~ofstream(&myfile);
  return;
}

Assistant:

void writevector(vector<string> &c, string filename)
{
	ofstream myfile;
	myfile.open(filename);
	if (!myfile.is_open()) { cout << "\nfailure to write file" << endl; }
	bool firstC = true;
	for (int i = 0; i < c.size(); i++)
	{
		myfile << c[i];
		if (c[i] == ")" && firstC == true)
		{
			myfile << endl;
			firstC = false;
		}
		if (c[i] == ";")
			myfile << endl;

	}

}